

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

void device3(void *arg)

{
  int sock;
  int iVar1;
  bool bVar2;
  int deve;
  int rc;
  void *arg_local;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                          ,0x58,2,0x70);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x59,sock,"inproc://e");
  iVar1 = nn_device(sock,0xffffffff);
  bVar2 = false;
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    bVar2 = iVar1 == 0x9523dfd;
  }
  if (!bVar2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
            ,0x5d);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0x60,sock);
  return;
}

Assistant:

void device3 (NN_UNUSED void *arg)
{
    int rc;
    int deve;

    /*  Intialise the device socket. */
    deve = test_socket (AF_SP_RAW, NN_BUS);
    test_bind (deve, SOCKET_ADDRESS_E);

    /*  Run the device. */
    rc = nn_device (deve, -1);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (deve);
}